

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

bool __thiscall rcg::Stream::getDefinesPayloadsize(Stream *this)

{
  bool bVar1;
  
  std::recursive_mutex::lock(&this->mtx);
  bVar1 = anon_unknown_6::getStreamBool(&this->gentl,this->stream,9);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return bVar1;
}

Assistant:

bool Stream::getDefinesPayloadsize()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  return getStreamBool(gentl, stream, GenTL::STREAM_INFO_DEFINES_PAYLOADSIZE);
}